

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedPrinter.cpp
# Opt level: O0

string * __thiscall
llvm::to_hexString_abi_cxx11_
          (string *__return_storage_ptr__,llvm *this,uint64_t Value,bool UpperCase)

{
  string *psVar1;
  FormattedNumber local_98;
  undefined1 local_70 [8];
  raw_string_ostream stream;
  string number;
  bool UpperCase_local;
  uint64_t Value_local;
  
  std::__cxx11::string::string((string *)&stream.OS);
  raw_string_ostream::raw_string_ostream((raw_string_ostream *)local_70,(string *)&stream.OS);
  format_hex_no_prefix(&local_98,(uint64_t)this,1,(bool)((byte)Value & 1));
  raw_ostream::operator<<((raw_ostream *)local_70,&local_98);
  psVar1 = raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_70);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_70);
  std::__cxx11::string::~string((string *)&stream.OS);
  return __return_storage_ptr__;
}

Assistant:

const std::string to_hexString(uint64_t Value, bool UpperCase) {
  std::string number;
  llvm::raw_string_ostream stream(number);
  stream << format_hex_no_prefix(Value, 1, UpperCase);
  return stream.str();
}